

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring_bitmap_t * roaring_bitmap_and(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  _Bool _Var3;
  uint16_t uVar4;
  uint16_t uVar5;
  roaring_array_t *prVar6;
  container_t *pcVar7;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  roaring_bitmap_t *answer;
  uint32_t neededcap;
  int length2;
  int length1;
  uint8_t result_type;
  int32_t in_stack_ffffffffffffff98;
  undefined2 in_stack_ffffffffffffff9c;
  undefined1 in_stack_ffffffffffffff9e;
  uint8_t typecode;
  roaring_array_t *ra;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 uVar8;
  undefined2 uVar9;
  uint16_t key;
  roaring_array_t *in_stack_ffffffffffffffb0;
  uint8_t type2_00;
  undefined4 in_stack_ffffffffffffffc8;
  int local_30;
  int local_2c;
  uint8_t type1_00;
  
  iVar1 = in_RDI->size;
  iVar2 = in_RSI->size;
  if (iVar2 < iVar1) {
    uVar9 = (undefined2)iVar2;
    key = (uint16_t)((uint)iVar2 >> 0x10);
  }
  else {
    uVar9 = (undefined2)iVar1;
    key = (uint16_t)((uint)iVar1 >> 0x10);
  }
  prVar6 = &roaring_bitmap_create_with_capacity(CONCAT22(key,uVar9))->high_low_container;
  ra = prVar6;
  _Var3 = is_cow((roaring_bitmap_t *)in_RDI);
  uVar8 = CONCAT13(1,(int3)in_stack_ffffffffffffffa8);
  if (!_Var3) {
    _Var3 = is_cow((roaring_bitmap_t *)in_RSI);
    uVar8 = CONCAT13(_Var3,(int3)uVar8);
  }
  roaring_bitmap_set_copy_on_write((roaring_bitmap_t *)ra,SUB41((uint)uVar8 >> 0x18,0));
  local_2c = 0;
  local_30 = 0;
  while (typecode = local_2c < iVar1 && local_30 < iVar2, local_2c < iVar1 && local_30 < iVar2) {
    uVar4 = ra_get_key_at_index(in_RDI,(uint16_t)local_2c);
    uVar5 = ra_get_key_at_index(in_RSI,(uint16_t)local_30);
    type2_00 = (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 0x38);
    if (uVar4 == uVar5) {
      pcVar7 = ra_get_container_at_index(in_RDI,(uint16_t)local_2c,&stack0xffffffffffffffcb);
      type1_00 = (uint8_t)((ulong)pcVar7 >> 0x38);
      pcVar7 = ra_get_container_at_index(in_RSI,(uint16_t)local_30,&stack0xffffffffffffffca);
      in_stack_ffffffffffffffb0 =
           (roaring_array_t *)
           container_and((container_t *)CONCAT26(uVar4,CONCAT24(uVar5,in_stack_ffffffffffffffc8)),
                         type1_00,pcVar7,type2_00,(uint8_t *)CONCAT26(key,CONCAT24(uVar9,uVar8)));
      _Var3 = container_nonzero_cardinality
                        ((container_t *)
                         CONCAT17(typecode,CONCAT16(in_stack_ffffffffffffff9e,
                                                    CONCAT24(in_stack_ffffffffffffff9c,
                                                             in_stack_ffffffffffffff98))),'\0');
      if (_Var3) {
        ra_append(in_stack_ffffffffffffffb0,key,ra,typecode);
      }
      else {
        container_free(ra,typecode);
      }
      local_2c = local_2c + 1;
      local_30 = local_30 + 1;
    }
    else if (uVar4 < uVar5) {
      local_2c = ra_advance_until(ra,CONCAT11(typecode,in_stack_ffffffffffffff9e),
                                  in_stack_ffffffffffffff98);
    }
    else {
      local_30 = ra_advance_until(ra,CONCAT11(typecode,in_stack_ffffffffffffff9e),
                                  in_stack_ffffffffffffff98);
    }
  }
  return (roaring_bitmap_t *)prVar6;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_and(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint32_t neededcap = length1 > length2 ? length2 : length1;
    roaring_bitmap_t *answer = roaring_bitmap_create_with_capacity(neededcap);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));

    int pos1 = 0, pos2 = 0;

    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c = container_and(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);  // otherwise: memory leak!
            }
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}